

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O0

void __thiscall
Assimp::StreamWriter<false,_false>::PutString(StreamWriter<false,_false> *this,string *s)

{
  size_t sVar1;
  long lVar2;
  size_type sVar3;
  reference __dest;
  void *__src;
  size_t __n;
  void *dest;
  string *s_local;
  StreamWriter<false,_false> *this_local;
  
  sVar1 = this->cursor;
  lVar2 = std::__cxx11::string::size();
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer);
  if (sVar3 <= sVar1 + lVar2) {
    sVar1 = this->cursor;
    lVar2 = std::__cxx11::string::size();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->buffer,sVar1 + lVar2);
  }
  __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->buffer,this->cursor);
  __src = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  memcpy(__dest,__src,__n);
  lVar2 = std::__cxx11::string::size();
  this->cursor = lVar2 + this->cursor;
  return;
}

Assistant:

void PutString(const std::string& s)
    {
        // as Put(T f) below
        if (cursor + s.size() >= buffer.size()) {
            buffer.resize(cursor + s.size());
        }
        void* dest = &buffer[cursor];
        ::memcpy(dest, s.c_str(), s.size());
        cursor += s.size();
    }